

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

DiagnosticStream * __thiscall
anon_unknown.dwarf_21a7766::Parser::diagnostic
          (DiagnosticStream *__return_storage_ptr__,Parser *this,spv_result_t error)

{
  MessageConsumer *consumer;
  spv_position_t position;
  allocator<char> local_59;
  string local_58;
  undefined8 local_38;
  undefined8 local_30;
  size_t local_28;
  spv_result_t local_1c;
  Parser *pPStack_18;
  spv_result_t error_local;
  Parser *this_local;
  
  local_38 = 0;
  local_30 = 0;
  local_28 = (this->_).instruction_count;
  consumer = this->consumer_;
  local_1c = error;
  pPStack_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  position.column = local_30;
  position.line = local_38;
  position.index = local_28;
  spvtools::DiagnosticStream::DiagnosticStream
            (__return_storage_ptr__,position,consumer,&local_58,local_1c);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

spvtools::DiagnosticStream diagnostic(spv_result_t error) {
    return spvtools::DiagnosticStream({0, 0, _.instruction_count}, consumer_,
                                      "", error);
  }